

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_expr.hpp
# Opt level: O1

int __thiscall
viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::clone
          (rt_binary_expr<viennamath::rt_expression_interface<double>_> *this,__fn *__fn,
          void *__child_stack,int __flags,void *__arg,...)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined8 *puVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  puVar4 = (undefined8 *)operator_new(0x20);
  iVar1 = (*((this->lhs_)._M_ptr)->_vptr_rt_expression_interface[2])();
  iVar2 = (*((this->op_)._M_ptr)->_vptr_op_interface[2])();
  iVar3 = (*((this->rhs_)._M_ptr)->_vptr_rt_expression_interface[2])();
  *puVar4 = &PTR__rt_binary_expr_00112648;
  puVar4[1] = CONCAT44(extraout_var,iVar1);
  puVar4[2] = CONCAT44(extraout_var_00,iVar2);
  puVar4[3] = CONCAT44(extraout_var_01,iVar3);
  return (int)puVar4;
}

Assistant:

InterfaceType * clone() const { return new rt_binary_expr(lhs_->clone(), op_->clone(), rhs_->clone()); }